

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockets_kernel_2.h
# Opt level: O0

int __thiscall dlib::connection::shutdown_outgoing(connection *this)

{
  int iVar1;
  long in_RDI;
  int temp;
  undefined4 local_4;
  
  mutex::lock((mutex *)0x3d78dc);
  if (((*(byte *)(in_RDI + 0x59) & 1) == 0) && ((*(byte *)(in_RDI + 0x58) & 1) == 0)) {
    *(undefined1 *)(in_RDI + 0x59) = 1;
    iVar1 = ::shutdown(*(int *)(in_RDI + 8),1);
    *(int *)(in_RDI + 0x5c) = iVar1;
    local_4 = *(int *)(in_RDI + 0x5c);
    mutex::unlock((mutex *)0x3d793c);
  }
  else {
    mutex::unlock((mutex *)0x3d7900);
    local_4 = *(int *)(in_RDI + 0x5c);
  }
  return local_4;
}

Assistant:

int shutdown_outgoing (
        ) 
        {
            sd_mutex.lock();
            if (sdo || sd)
            {
                sd_mutex.unlock();
                return sdr;
            }
            sdo = true;
            sdr = ::shutdown(connection_socket,SHUT_WR); 
            int temp = sdr;
            sd_mutex.unlock();
            return temp;  
        }